

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

Distortion * gmath::Distortion::create(Properties *prop,int id)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Distortion *pDVar3;
  int in_ECX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  void *pvVar4;
  __fn *p_Var5;
  void *in_R8;
  double dVar6;
  RadialDistortion *this;
  Properties *prop_00;
  int in_stack_00000014;
  Properties *in_stack_00000018;
  RationalTangentialThinPrismDistortion *in_stack_00000020;
  RadialTangentialDistortion rtd;
  RationalTangentialDistortion ratd;
  RationalTangentialThinPrismDistortion ratpd;
  EquidistantDistortion ed;
  int in_stack_fffffffffffffed4;
  Properties *in_stack_fffffffffffffed8;
  EquidistantDistortion *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffef4;
  Properties *in_stack_fffffffffffffef8;
  Distortion in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff74;
  Properties *in_stack_ffffffffffffff78;
  RationalTangentialDistortion *in_stack_ffffffffffffff80;
  EquidistantDistortion local_40;
  Distortion *local_8;
  
  EquidistantDistortion::EquidistantDistortion
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  p_Var5 = (__fn *)0x0;
  dVar6 = EquidistantDistortion::getParameter(&local_40,0);
  pvVar4 = extraout_RDX;
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    p_Var5 = (__fn *)0x1;
    this = (RadialDistortion *)EquidistantDistortion::getParameter(&local_40,1);
    pvVar4 = extraout_RDX_00;
    if (((double)this == 0.0) && (!NAN((double)this))) {
      p_Var5 = (__fn *)0x2;
      prop_00 = (Properties *)EquidistantDistortion::getParameter(&local_40,2);
      pvVar4 = extraout_RDX_01;
      if (((double)prop_00 == 0.0) && (!NAN((double)prop_00))) {
        p_Var5 = (__fn *)0x3;
        dVar6 = EquidistantDistortion::getParameter(&local_40,3);
        pvVar4 = extraout_RDX_02;
        if ((dVar6 == 0.0) && (!NAN(dVar6))) {
          RationalTangentialThinPrismDistortion::RationalTangentialThinPrismDistortion
                    (in_stack_00000020,in_stack_00000018,in_stack_00000014);
          iVar1 = (int)((ulong)dVar6 >> 0x20);
          p_Var5 = (__fn *)0x8;
          dVar6 = RationalTangentialThinPrismDistortion::getParameter
                            ((RationalTangentialThinPrismDistortion *)&stack0xffffffffffffff48,8);
          pvVar4 = extraout_RDX_03;
          if ((dVar6 != 0.0) || (NAN(dVar6))) {
LAB_001c9f49:
            iVar1 = RationalTangentialThinPrismDistortion::clone
                              ((RationalTangentialThinPrismDistortion *)&stack0xffffffffffffff48,
                               p_Var5,pvVar4,in_ECX,in_R8);
            local_8 = (Distortion *)CONCAT44(extraout_var_00,iVar1);
          }
          else {
            p_Var5 = (__fn *)0x9;
            dVar6 = RationalTangentialThinPrismDistortion::getParameter
                              ((RationalTangentialThinPrismDistortion *)&stack0xffffffffffffff48,9);
            pvVar4 = extraout_RDX_04;
            if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_001c9f49;
            p_Var5 = (__fn *)0xa;
            dVar6 = RationalTangentialThinPrismDistortion::getParameter
                              ((RationalTangentialThinPrismDistortion *)&stack0xffffffffffffff48,10)
            ;
            pvVar4 = extraout_RDX_05;
            if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_001c9f49;
            p_Var5 = (__fn *)0xb;
            dVar6 = RationalTangentialThinPrismDistortion::getParameter
                              ((RationalTangentialThinPrismDistortion *)&stack0xffffffffffffff48,0xb
                              );
            pvVar4 = extraout_RDX_06;
            if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_001c9f49;
            RationalTangentialDistortion::RationalTangentialDistortion
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74
                      );
            p_Var5 = (__fn *)0x5;
            dVar6 = RationalTangentialDistortion::getParameter
                              ((RationalTangentialDistortion *)&stack0xffffffffffffff00,5);
            pvVar4 = extraout_RDX_07;
            if ((dVar6 != 0.0) || (NAN(dVar6))) {
LAB_001ca034:
              iVar1 = RationalTangentialDistortion::clone
                                ((RationalTangentialDistortion *)&stack0xffffffffffffff00,p_Var5,
                                 pvVar4,in_ECX,in_R8);
              local_8 = (Distortion *)CONCAT44(extraout_var_01,iVar1);
            }
            else {
              p_Var5 = (__fn *)0x6;
              dVar6 = RationalTangentialDistortion::getParameter
                                ((RationalTangentialDistortion *)&stack0xffffffffffffff00,6);
              pvVar4 = extraout_RDX_08;
              if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_001ca034;
              p_Var5 = (__fn *)0x7;
              dVar6 = RationalTangentialDistortion::getParameter
                                ((RationalTangentialDistortion *)&stack0xffffffffffffff00,7);
              pvVar4 = extraout_RDX_09;
              if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_001ca034;
              RadialTangentialDistortion::RadialTangentialDistortion
                        ((RadialTangentialDistortion *)in_stack_ffffffffffffff00._vptr_Distortion,
                         in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
              p_Var5 = (__fn *)0x0;
              dVar6 = RadialTangentialDistortion::getParameter
                                ((RadialTangentialDistortion *)&stack0xfffffffffffffec8,0);
              pvVar4 = extraout_RDX_10;
              if ((dVar6 != 0.0) || (NAN(dVar6))) {
LAB_001ca0f1:
                iVar1 = RadialTangentialDistortion::clone
                                  ((RadialTangentialDistortion *)&stack0xfffffffffffffec8,p_Var5,
                                   pvVar4,in_ECX,in_R8);
                local_8 = (Distortion *)CONCAT44(extraout_var_02,iVar1);
              }
              else {
                p_Var5 = (__fn *)0x1;
                dVar6 = RadialTangentialDistortion::getParameter
                                  ((RadialTangentialDistortion *)&stack0xfffffffffffffec8,1);
                pvVar4 = extraout_RDX_11;
                if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_001ca0f1;
                iVar2 = RadialTangentialDistortion::countParameter
                                  ((RadialTangentialDistortion *)&stack0xfffffffffffffec8);
                if (iVar2 < 3) {
                  dVar6 = RadialTangentialDistortion::getParameter
                                    ((RadialTangentialDistortion *)&stack0xfffffffffffffec8,0);
                  if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_001ca1ac;
                  dVar6 = RadialTangentialDistortion::getParameter
                                    ((RadialTangentialDistortion *)&stack0xfffffffffffffec8,1);
                  if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_001ca1ac;
                  local_8 = (Distortion *)0x0;
                }
                else {
LAB_001ca1ac:
                  pDVar3 = (Distortion *)operator_new(0x28);
                  RadialDistortion::RadialDistortion(this,prop_00,iVar1);
                  local_8 = pDVar3;
                }
              }
              RadialTangentialDistortion::~RadialTangentialDistortion
                        ((RadialTangentialDistortion *)0x1ca232);
            }
            RationalTangentialDistortion::~RationalTangentialDistortion
                      ((RationalTangentialDistortion *)0x1ca250);
          }
          RationalTangentialThinPrismDistortion::~RationalTangentialThinPrismDistortion
                    ((RationalTangentialThinPrismDistortion *)0x1ca26e);
          goto LAB_001ca27f;
        }
      }
    }
  }
  iVar1 = EquidistantDistortion::clone(&local_40,p_Var5,pvVar4,in_ECX,in_R8);
  local_8 = (Distortion *)CONCAT44(extraout_var,iVar1);
LAB_001ca27f:
  EquidistantDistortion::~EquidistantDistortion((EquidistantDistortion *)0x1ca28c);
  return local_8;
}

Assistant:

Distortion *Distortion::create(const gutil::Properties &prop, int id)
{
  // try equidistant model

  EquidistantDistortion ed(prop, id);

  if (ed.getParameter(0) != 0 || ed.getParameter(1) != 0 ||
      ed.getParameter(2) != 0 || ed.getParameter(3) != 0)
  {
    return ed.clone();
  }

  // create best fitting model, i.e. with lowest number of parameters

  RationalTangentialThinPrismDistortion ratpd(prop, id);

  if (ratpd.getParameter(8) != 0 || ratpd.getParameter(9) != 0 || ratpd.getParameter(10) != 0 ||
      ratpd.getParameter(11) != 0)
  {
    return ratpd.clone();
  }

  RationalTangentialDistortion ratd(prop, id);

  if (ratd.getParameter(5) != 0 || ratd.getParameter(6) != 0 || ratd.getParameter(7) != 0)
  {
    return ratd.clone();
  }

  RadialTangentialDistortion rtd(prop, id);

  if (rtd.getParameter(0) != 0 || rtd.getParameter(1) != 0)
  {
    return rtd.clone();
  }

  if (rtd.countParameter() > 2 || rtd.getParameter(0) != 0 || rtd.getParameter(1) != 0)
  {
    return new RadialDistortion(prop, id);
  }

  return 0;
}